

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::StringBuilder::_opHex(StringBuilder *this,uint32_t op,void *data,size_t len)

{
  ulong in_RCX;
  char *in_RDX;
  uint32_t unaff_retaddr;
  size_t i;
  char *src;
  char *dst;
  ulong local_40;
  char *local_38;
  char *local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RCX < 0x7fffffffffffffff) &&
     (local_30 = prepare((StringBuilder *)i,unaff_retaddr,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
     local_30 != (char *)0x0)) {
    local_38 = in_RDX;
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      *local_30 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)((int)*local_38 >> 4 & 0xf)];
      local_30[1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)((int)*local_38 & 0xf)];
      local_30 = local_30 + 2;
      local_38 = local_38 + 1;
    }
    return 0;
  }
  return 1;
}

Assistant:

Error StringBuilder::_opHex(uint32_t op, const void* data, size_t len) noexcept {
  char* dst;

  if (len >= IntTraits<size_t>::maxValue() / 2 || !(dst = prepare(op, len * 2)))
    return DebugUtils::errored(kErrorNoHeapMemory);;

  const char* src = static_cast<const char*>(data);
  for (size_t i = 0; i < len; i++, dst += 2, src++) {
    dst[0] = StringBuilder_numbers[(src[0] >> 4) & 0xF];
    dst[1] = StringBuilder_numbers[(src[0]     ) & 0xF];
  }
  return kErrorOk;
}